

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal<std::__cxx11::string&>
          (Reporter *this,ReturnCode return_code,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ReturnCode returnCode;
  basic_string_view<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  ostream *os;
  basic_string_view<char> in_stack_ffffffffffffff58;
  basic_string_view<char> local_90;
  undefined8 local_80;
  char *local_68;
  basic_string_view<char> *local_60;
  char *local_58;
  basic_string_view<char> *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  char *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  this_00 = &local_90;
  local_68 = "{} fatal: ";
  local_58 = "{} fatal: ";
  local_90.data_ = "{} fatal: ";
  local_80 = in_RDX;
  local_60 = this_00;
  local_50 = this_00;
  sVar1 = std::char_traits<char>::length((char_type *)0x2399af);
  this_00->size_ = sVar1;
  local_28 = local_68;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff50,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff48);
  local_10 = &stack0xffffffffffffff60;
  local_18 = local_80;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::char_traits<char>,std::allocator<char>>(this_00,in_RDI);
  returnCode = (ReturnCode)((ulong)in_RDI >> 0x20);
  local_8 = local_18;
  ::fmt::v10::print<>(in_stack_ffffffffffffff50,(format_string<>)in_stack_ffffffffffffff58);
  local_40 = &stack0xffffffffffffff50;
  local_48 = "\n";
  local_38 = "\n";
  os = (ostream *)0x387003;
  local_30 = local_40;
  sVar1 = std::char_traits<char>::length((char_type *)0x239a9e);
  local_20 = local_48;
  ::fmt::v10::print<>(os,(format_string<>)in_stack_ffffffffffffff58);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError((FatalError *)this_00,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }